

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O2

int lws_ws_rx_sm(lws *wsi,char already_processed,uchar c)

{
  size_t *psVar1;
  undefined1 *puVar2;
  short sVar3;
  ulong uVar4;
  uchar *puVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  _lws_websocket_related *p_Var10;
  ushort uVar11;
  uint uVar12;
  size_t sVar13;
  byte bVar14;
  uint8_t uVar15;
  char *pcVar16;
  lws_callback_reasons reason;
  lws_callback_function *callback_function;
  size_t sStack_60;
  uchar *local_50;
  
  if ((wsi->field_0x2dd & 0x10) != 0) {
    return -1;
  }
  iVar8 = 0;
  iVar9 = 0;
  switch(wsi->lws_rx_parse_state) {
  case '\0':
    uVar7 = (uint)wsi->ws->ietf_spec_revision;
    if (uVar7 != 0xd) {
      _lws_log(2,"lws_ws_rx_sm: unknown spec version %d\n",(ulong)uVar7);
      return 0;
    }
    puVar2 = &wsi->ws->field_0x95;
    *puVar2 = *puVar2 | 4;
  case '\x04':
    p_Var10 = wsi->ws;
    p_Var10->opcode = c & 0xf;
    p_Var10->rsv = c & 0x70;
    *(ushort *)&p_Var10->field_0x95 = *(ushort *)&p_Var10->field_0x95 & 0xfffe | (ushort)(c >> 7);
    puVar2 = &wsi->ws->field_0x95;
    *(ushort *)puVar2 = *(ushort *)puVar2 & 0xf7ff;
    p_Var10 = wsi->ws;
    if (((p_Var10->opcode & 8) != 0) && ((p_Var10->field_0x95 & 1) == 0)) {
      pcVar16 = "frag ctl";
      goto LAB_0011f0c8;
    }
    switch(p_Var10->opcode) {
    case '\0':
      if ((p_Var10->field_0x96 & 1) != 0) break;
      goto LAB_0011f0c1;
    case '\x01':
      *(ushort *)&p_Var10->field_0x95 =
           (*(ushort *)&p_Var10->field_0x95 & 0xfbff) +
           ((ushort)(int)wsi->context->options & 0x100) * 4;
      p_Var10 = wsi->ws;
      if (p_Var10->opcode == '\x02') goto switchD_0011eac3_caseD_2;
      goto LAB_0011ef99;
    case '\x02':
switchD_0011eac3_caseD_2:
      p_Var10->field_0x96 = p_Var10->field_0x96 & 0xfb;
      p_Var10 = wsi->ws;
LAB_0011ef99:
      if ((*(ushort *)&p_Var10->field_0x95 >> 8 & 1) == 0) {
        p_Var10->rsv_first_msg = c & 0x70;
        *(ushort *)&p_Var10->field_0x95 =
             (*(ushort *)&p_Var10->field_0x95 & 0xfefd) + (ushort)(p_Var10->opcode == '\x02') * 2;
        puVar2 = &wsi->ws->field_0x95;
        *(ushort *)puVar2 = *(ushort *)puVar2 | 0x4000;
        uVar11 = *(ushort *)&wsi->ws->field_0x95;
        *(ushort *)&wsi->ws->field_0x95 = (uVar11 & 0xfeff | (uVar11 & 1) << 8) ^ 0x100;
        p_Var10 = wsi->ws;
        break;
      }
LAB_0011f0c1:
      pcVar16 = "bad cont";
      goto LAB_0011f0c8;
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\a':
    case '\v':
    case '\f':
    case '\r':
    case '\x0e':
    case '\x0f':
      lws_close_reason(wsi,LWS_CLOSE_STATUS_PROTOCOL_ERR,(uchar *)"bad opc",7);
      pcVar16 = "illegal opcode\n";
      iVar9 = 8;
LAB_0011ed1f:
      _lws_log(iVar9,pcVar16);
      return -1;
    case '\b':
      p_Var10->field_0x96 = p_Var10->field_0x96 & 0xfb;
      p_Var10 = wsi->ws;
      p_Var10->utf8 = '\0';
    }
    uVar11 = *(ushort *)&p_Var10->field_0x95;
    if (((byte)(p_Var10->opcode - 1) < 2 & (byte)(uVar11 >> 9)) == 1) {
      _lws_log(8,"hey you owed us a FIN\n");
      pcVar16 = "bad fin";
      sStack_60 = 7;
    }
    else {
      if ((uVar11 & 1) != 0 && (p_Var10->opcode & 8) == 0) {
        *(ushort *)&p_Var10->field_0x95 = uVar11 & 0xfeff;
        puVar2 = &wsi->ws->field_0x95;
        *(ushort *)puVar2 = *(ushort *)puVar2 & 0xfdff;
        p_Var10 = wsi->ws;
        uVar11 = *(ushort *)&p_Var10->field_0x95;
      }
      if ((uVar11 & 1) == 0) {
        *(ushort *)&p_Var10->field_0x95 = uVar11 | 0x200;
        p_Var10 = wsi->ws;
      }
      wsi->lws_rx_parse_state = '\x05';
      if ((p_Var10->rsv & 0xbf) == 0) {
        return 0;
      }
      pcVar16 = "rsv bits";
LAB_0011f0c8:
      sStack_60 = 8;
    }
    lws_close_reason(wsi,LWS_CLOSE_STATUS_PROTOCOL_ERR,(uchar *)pcVar16,sStack_60);
    iVar9 = -1;
    break;
  case '\x01':
    wsi->ws->mask[1] = c;
    if (c != '\0') {
      puVar2 = &wsi->ws->field_0x95;
      *(ushort *)puVar2 = *(ushort *)puVar2 & 0xfffb;
    }
    wsi->lws_rx_parse_state = '\x02';
    iVar9 = iVar8;
    break;
  case '\x02':
    wsi->ws->mask[2] = c;
    if (c != '\0') {
      puVar2 = &wsi->ws->field_0x95;
      *(ushort *)puVar2 = *(ushort *)puVar2 & 0xfffb;
    }
    wsi->lws_rx_parse_state = '\x03';
    iVar9 = iVar8;
    break;
  case '\x03':
    wsi->ws->mask[3] = c;
    if (c != '\0') {
      puVar2 = &wsi->ws->field_0x95;
      *(ushort *)puVar2 = *(ushort *)puVar2 & 0xfffb;
    }
    wsi->ws->mask_idx = '\0';
    wsi->lws_rx_parse_state = '\x04';
    iVar9 = iVar8;
    break;
  case '\x05':
    *(ushort *)&wsi->ws->field_0x95 =
         (*(ushort *)&wsi->ws->field_0x95 & 0xfff7) + (ushort)(c >> 7) * 8;
    bVar14 = c & 0x7f;
    if (bVar14 == 0x7f) {
      if ((wsi->ws->opcode & 8) == 0) {
        wsi->lws_rx_parse_state = '\b';
        return 0;
      }
    }
    else {
      if (bVar14 != 0x7e) {
        p_Var10 = wsi->ws;
        p_Var10->rx_packet_length = (ulong)bVar14;
        if ((p_Var10->field_0x95 & 8) != 0) goto LAB_0011ed4d;
        if (bVar14 != 0) goto LAB_0011e8aa;
        goto LAB_0011eda1;
      }
      if ((wsi->ws->opcode & 8) == 0) {
        wsi->lws_rx_parse_state = '\x06';
        return 0;
      }
    }
    pcVar16 = "Control frame with xtended length is illegal\n";
    goto LAB_0011ed1d;
  case '\x06':
    wsi->ws->rx_packet_length = (ulong)c << 8;
    wsi->lws_rx_parse_state = '\a';
    iVar9 = iVar8;
    break;
  case '\a':
  case '\x0f':
    p_Var10 = wsi->ws;
    psVar1 = &p_Var10->rx_packet_length;
    *psVar1 = *psVar1 | (ulong)c;
    if ((p_Var10->field_0x95 & 8) == 0) {
LAB_0011e8aa:
      wsi->lws_rx_parse_state = '\x14';
      return 0;
    }
LAB_0011ed4d:
    wsi->lws_rx_parse_state = '\x10';
    iVar9 = iVar8;
    break;
  case '\b':
    if (-1 < (char)c) {
      wsi->ws->rx_packet_length = (ulong)c << 0x38;
      wsi->lws_rx_parse_state = '\t';
      return 0;
    }
    pcVar16 = "b63 of length must be zero\n";
LAB_0011ed1d:
    iVar9 = 2;
    goto LAB_0011ed1f;
  case '\t':
    psVar1 = &wsi->ws->rx_packet_length;
    *psVar1 = *psVar1 | (ulong)c << 0x30;
    wsi->lws_rx_parse_state = '\n';
    iVar9 = iVar8;
    break;
  case '\n':
    psVar1 = &wsi->ws->rx_packet_length;
    *psVar1 = *psVar1 | (ulong)c << 0x28;
    wsi->lws_rx_parse_state = '\v';
    iVar9 = iVar8;
    break;
  case '\v':
    psVar1 = &wsi->ws->rx_packet_length;
    *psVar1 = *psVar1 | (ulong)c << 0x20;
    wsi->lws_rx_parse_state = '\f';
    iVar9 = iVar8;
    break;
  case '\f':
    psVar1 = &wsi->ws->rx_packet_length;
    *psVar1 = *psVar1 | (ulong)c << 0x18;
    wsi->lws_rx_parse_state = '\r';
    iVar9 = iVar8;
    break;
  case '\r':
    psVar1 = &wsi->ws->rx_packet_length;
    *psVar1 = *psVar1 | (ulong)c << 0x10;
    wsi->lws_rx_parse_state = '\x0e';
    iVar9 = iVar8;
    break;
  case '\x0e':
    psVar1 = &wsi->ws->rx_packet_length;
    *psVar1 = *psVar1 | (ulong)c << 8;
    wsi->lws_rx_parse_state = '\x0f';
    iVar9 = iVar8;
    break;
  case '\x10':
    wsi->ws->mask[0] = c;
    if (c != '\0') {
      puVar2 = &wsi->ws->field_0x95;
      *(ushort *)puVar2 = *(ushort *)puVar2 & 0xfffb;
    }
    wsi->lws_rx_parse_state = '\x11';
    iVar9 = iVar8;
    break;
  case '\x11':
    wsi->ws->mask[1] = c;
    if (c != '\0') {
      puVar2 = &wsi->ws->field_0x95;
      *(ushort *)puVar2 = *(ushort *)puVar2 & 0xfffb;
    }
    wsi->lws_rx_parse_state = '\x12';
    iVar9 = iVar8;
    break;
  case '\x12':
    wsi->ws->mask[2] = c;
    if (c != '\0') {
      puVar2 = &wsi->ws->field_0x95;
      *(ushort *)puVar2 = *(ushort *)puVar2 & 0xfffb;
    }
    wsi->lws_rx_parse_state = '\x13';
    iVar9 = iVar8;
    break;
  case '\x13':
    wsi->ws->mask[3] = c;
    if (c != '\0') {
      puVar2 = &wsi->ws->field_0x95;
      *(ushort *)puVar2 = *(ushort *)puVar2 & 0xfffb;
    }
    wsi->lws_rx_parse_state = '\x14';
    p_Var10 = wsi->ws;
    p_Var10->mask_idx = '\0';
    if (p_Var10->rx_packet_length != 0) {
      return 0;
    }
LAB_0011eda1:
    wsi->lws_rx_parse_state = '\0';
    goto LAB_0011eda8;
  case '\x14':
    p_Var10 = wsi->ws;
    if (p_Var10->rx_ubuf == (uchar *)0x0) {
      __assert_fail("wsi->ws->rx_ubuf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/ws/ops-ws.c"
                    ,0x186,"int lws_ws_rx_sm(struct lws *, char, unsigned char)");
    }
    uVar7 = p_Var10->rx_ubuf_head + 0x10;
    if (p_Var10->rx_ubuf_alloc <= uVar7) {
      pcVar16 = "Attempted overflow \n";
      iVar9 = 1;
      goto LAB_0011ed1f;
    }
    if ((already_processed & 1U) == 0) {
      if ((p_Var10->field_0x95 & 4) == 0) {
        bVar14 = p_Var10->mask_idx;
        p_Var10->mask_idx = bVar14 + 1;
        c = c ^ p_Var10->mask[bVar14 & 3];
      }
      p_Var10->rx_ubuf_head = p_Var10->rx_ubuf_head + 1;
      p_Var10->rx_ubuf[uVar7] = c;
      p_Var10 = wsi->ws;
      sVar13 = p_Var10->rx_packet_length - 1;
      p_Var10->rx_packet_length = sVar13;
    }
    else {
      sVar13 = p_Var10->rx_packet_length;
    }
    if (sVar13 == 0) {
      _lws_log(0x10,"%s: ws fragment length exhausted\n","lws_ws_rx_sm");
      goto LAB_0011eda1;
    }
    uVar4 = wsi->protocol->rx_buffer_size;
    if (uVar4 == 0) {
      if (p_Var10->rx_ubuf_head != wsi->context->pt_serv_buf_size) {
        return 0;
      }
    }
    else if (uVar4 != p_Var10->rx_ubuf_head) {
      return 0;
    }
LAB_0011eda8:
    bVar6 = false;
    _lws_log(0x20,"spill on %s\n",wsi->protocol->name);
    p_Var10 = wsi->ws;
    uVar15 = p_Var10->opcode;
    reason = LWS_CALLBACK_RECEIVE;
    switch(uVar15) {
    case '\0':
    case '\x01':
    case '\x02':
      break;
    default:
      _lws_log(0x20,"unknown opc %x\n");
      return -1;
    case '\b':
      if (-1 < (short)*(ushort *)&p_Var10->field_0x95) {
        *(ushort *)&p_Var10->field_0x95 = *(ushort *)&p_Var10->field_0x95 | 0x8000;
        p_Var10 = wsi->ws;
        puVar5 = p_Var10->rx_ubuf;
        if ((((wsi->context->options & 0x100) != 0) && (2 < p_Var10->rx_ubuf_head)) &&
           (iVar9 = lws_check_utf8(&p_Var10->utf8,puVar5 + 0x12,(ulong)(p_Var10->rx_ubuf_head - 2)),
           iVar9 != 0)) {
          uVar7 = 0;
          local_50 = (uchar *)0x0;
          goto LAB_0011f1fd;
        }
        sVar3 = (short)wsi->wsistate;
        if (sVar3 == 0x11c) {
          return -1;
        }
        if (sVar3 == 0x11d) {
          pcVar16 = "seen client close ack\n";
        }
        else {
          iVar9 = lws_partial_buffered(wsi);
          if (iVar9 == 0) {
            p_Var10 = wsi->ws;
            uVar7 = p_Var10->rx_ubuf_head;
            if (1 < uVar7) {
              uVar11 = *(ushort *)(puVar5 + 0x10) << 8 | *(ushort *)(puVar5 + 0x10) >> 8;
              uVar12 = (uint)uVar11;
              if ((uVar12 - 0x3f8 < 0x7c0 || (uVar12 & 0xfffffffc) == 0x3f4) ||
                  ((uVar11 == 0x3ee || uVar11 < 1000) || (uVar12 & 0xfffffffe) == 0x3ec)) {
                puVar5[0x10] = '\x03';
                puVar5[0x11] = 0xea;
                p_Var10 = wsi->ws;
                uVar7 = p_Var10->rx_ubuf_head;
              }
            }
            iVar9 = user_callback_handle_rxflow
                              (wsi->protocol->callback,wsi,LWS_CALLBACK_WS_PEER_INITIATED_CLOSE,
                               wsi->user_space,p_Var10->rx_ubuf + 0x10,(ulong)uVar7);
            if (iVar9 != 0) {
              return -1;
            }
            _lws_log(0x20,"server sees client close packet\n");
            lwsi_set_state(wsi,0x11c);
            puVar2 = &wsi->ws->field_0x95;
            *(ushort *)puVar2 = *(ushort *)puVar2 | 0x40;
            p_Var10 = wsi->ws;
            goto LAB_0011ef0a;
          }
          wsi->field_0x2dd = wsi->field_0x2dd | 0x10;
          pcVar16 = "Closing on peer close due to pending tx\n";
        }
        iVar9 = 0x20;
        goto LAB_0011ed1f;
      }
      uVar15 = '\b';
      bVar6 = false;
      break;
    case '\t':
      _lws_log(8,"received %d byte ping, sending pong\n",(ulong)p_Var10->rx_ubuf_head);
      p_Var10 = wsi->ws;
      if ((p_Var10->field_0x95 & 0x80) == 0) {
LAB_0011ef0a:
        if ((ulong)p_Var10->rx_ubuf_head < 0x7e) {
          memcpy(p_Var10->ping_payload_buf + 0x10,p_Var10->rx_ubuf + 0x10,
                 (ulong)p_Var10->rx_ubuf_head);
          p_Var10 = wsi->ws;
          p_Var10->ping_payload_len = (uint8_t)p_Var10->rx_ubuf_head;
          p_Var10->field_0x95 = p_Var10->field_0x95 | 0x80;
          lws_callback_on_writable(wsi);
          goto LAB_0011f273;
        }
        pcVar16 = "DROP PING payload too large\n";
      }
      else {
        pcVar16 = "DROP PING since one pending\n";
      }
      _lws_log(0x20,pcVar16);
LAB_0011f273:
      wsi->ws->rx_ubuf_head = 0;
      return 0;
    case '\n':
      _lws_log(8,"received pong\n");
      lwsl_hexdump(wsi->ws->rx_ubuf + 0x10,(ulong)wsi->ws->rx_ubuf_head);
      lws_validity_confirmed(wsi);
      p_Var10 = wsi->ws;
      uVar15 = p_Var10->opcode;
      reason = LWS_CALLBACK_RECEIVE_PONG;
      bVar6 = true;
    }
    uVar7 = p_Var10->rx_ubuf_head;
    iVar9 = 0;
    if (((uVar15 != '\n') || (uVar7 != 0)) && ((wsi->wsistate & 0xfffe) != 0x11c)) {
      local_50 = p_Var10->rx_ubuf + 0x10;
      sVar13 = (size_t)(int)uVar7;
      bVar14 = -1 < (int)uVar7 | bVar6;
      iVar9 = 0;
      _lws_log(0x10,"%s: post ext ret %d, ebuf in %d / out %d\n","lws_ws_rx_sm",1,(ulong)uVar7,
               (ulong)uVar7);
      if (uVar7 == 0) {
        if ((bool)(wsi->wsistate_pre_close == 0 & bVar14)) {
LAB_0011f316:
          callback_function = wsi->protocol->callback;
          iVar9 = 0;
          if (callback_function != (lws_callback_function *)0x0 && (already_processed & 2U) == 0) {
            if (bVar6) {
              _lws_log(8,"Doing pong callback\n");
              callback_function = wsi->protocol->callback;
            }
            iVar9 = user_callback_handle_rxflow
                              (callback_function,wsi,reason,wsi->user_space,local_50,sVar13);
          }
          puVar2 = &wsi->ws->field_0x95;
          *(ushort *)puVar2 = *(ushort *)puVar2 & 0xbfff;
        }
      }
      else {
        if ((*(ushort *)&wsi->ws->field_0x95 & 0xc00) == 0x400) {
          iVar8 = lws_check_utf8(&wsi->ws->utf8,local_50,sVar13);
          if (iVar8 == 0) {
            p_Var10 = wsi->ws;
            if (((p_Var10->rx_packet_length != 0) || ((p_Var10->field_0x95 & 1) == 0)) ||
               (p_Var10->utf8 == '\0')) goto LAB_0011f2ef;
            _lws_log(8,"FINAL utf8 error\n");
            pcVar16 = "partial utf8";
            sStack_60 = 0xc;
          }
          else {
            pcVar16 = "bad utf8";
            sStack_60 = 8;
          }
          lws_close_reason(wsi,LWS_CLOSE_STATUS_INVALID_PAYLOAD,(uchar *)pcVar16,sStack_60);
LAB_0011f1fd:
          _lws_log(4,"utf8 error\n");
          lwsl_hexdump_level(4,local_50,(long)(int)uVar7);
          return -1;
        }
LAB_0011f2ef:
        if ((bool)(wsi->wsistate_pre_close == 0 & bVar14)) {
          if (uVar7 != 0) {
            local_50[sVar13] = '\0';
          }
          goto LAB_0011f316;
        }
      }
      p_Var10 = wsi->ws;
    }
    p_Var10->rx_ubuf_head = 0;
  }
  return iVar9;
}

Assistant:

int
lws_ws_rx_sm(struct lws *wsi, char already_processed, unsigned char c)
{
	int callback_action = LWS_CALLBACK_RECEIVE;
	struct lws_ext_pm_deflate_rx_ebufs pmdrx;
	unsigned short close_code;
	unsigned char *pp;
	int ret = 0;
	int n = 0;
#if !defined(LWS_WITHOUT_EXTENSIONS)
	int rx_draining_ext = 0;
	int lin;
#endif

	pmdrx.eb_in.token = NULL;
	pmdrx.eb_in.len = 0;
	pmdrx.eb_out.token = NULL;
	pmdrx.eb_out.len = 0;

	if (wsi->socket_is_permanently_unusable)
		return -1;

	switch (wsi->lws_rx_parse_state) {
	case LWS_RXPS_NEW:
#if !defined(LWS_WITHOUT_EXTENSIONS)
		if (wsi->ws->rx_draining_ext) {
			pmdrx.eb_in.token = NULL;
			pmdrx.eb_in.len = 0;
			pmdrx.eb_out.token = NULL;
			pmdrx.eb_out.len = 0;
			lws_remove_wsi_from_draining_ext_list(wsi);
			rx_draining_ext = 1;
			lwsl_debug("%s: doing draining flow\n", __func__);

			goto drain_extension;
		}
#endif
		switch (wsi->ws->ietf_spec_revision) {
		case 13:
			/*
			 * no prepended frame key any more
			 */
			wsi->ws->all_zero_nonce = 1;
			goto handle_first;

		default:
			lwsl_warn("lws_ws_rx_sm: unknown spec version %d\n",
				  wsi->ws->ietf_spec_revision);
			break;
		}
		break;
	case LWS_RXPS_04_mask_1:
		wsi->ws->mask[1] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;
		wsi->lws_rx_parse_state = LWS_RXPS_04_mask_2;
		break;
	case LWS_RXPS_04_mask_2:
		wsi->ws->mask[2] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;
		wsi->lws_rx_parse_state = LWS_RXPS_04_mask_3;
		break;
	case LWS_RXPS_04_mask_3:
		wsi->ws->mask[3] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;

		/*
		 * start from the zero'th byte in the XOR key buffer since
		 * this is the start of a frame with a new key
		 */

		wsi->ws->mask_idx = 0;

		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_1;
		break;

	/*
	 *  04 logical framing from the spec (all this is masked when incoming
	 *  and has to be unmasked)
	 *
	 * We ignore the possibility of extension data because we don't
	 * negotiate any extensions at the moment.
	 *
	 *    0                   1                   2                   3
	 *    0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1
	 *   +-+-+-+-+-------+-+-------------+-------------------------------+
	 *   |F|R|R|R| opcode|R| Payload len |    Extended payload length    |
	 *   |I|S|S|S|  (4)  |S|     (7)     |             (16/63)           |
	 *   |N|V|V|V|       |V|             |   (if payload len==126/127)   |
	 *   | |1|2|3|       |4|             |                               |
	 *   +-+-+-+-+-------+-+-------------+ - - - - - - - - - - - - - - - +
	 *   |     Extended payload length continued, if payload len == 127  |
	 *   + - - - - - - - - - - - - - - - +-------------------------------+
	 *   |                               |         Extension data        |
	 *   +-------------------------------+ - - - - - - - - - - - - - - - +
	 *   :                                                               :
	 *   +---------------------------------------------------------------+
	 *   :                       Application data                        :
	 *   +---------------------------------------------------------------+
	 *
	 *  We pass payload through to userland as soon as we get it, ignoring
	 *  FIN.  It's up to userland to buffer it up if it wants to see a
	 *  whole unfragmented block of the original size (which may be up to
	 *  2^63 long!)
	 */

	case LWS_RXPS_04_FRAME_HDR_1:
handle_first:

		wsi->ws->opcode = c & 0xf;
		wsi->ws->rsv = c & 0x70;
		wsi->ws->final = !!((c >> 7) & 1);
		wsi->ws->defeat_check_utf8 = 0;

		if (((wsi->ws->opcode) & 8) && !wsi->ws->final) {
			lws_close_reason(wsi, LWS_CLOSE_STATUS_PROTOCOL_ERR,
					(uint8_t *)"frag ctl", 8);
			return -1;
		}

		switch (wsi->ws->opcode) {
		case LWSWSOPC_TEXT_FRAME:
			wsi->ws->check_utf8 = lws_check_opt(
				wsi->context->options,
				LWS_SERVER_OPTION_VALIDATE_UTF8);
			/* fallthru */
		case LWSWSOPC_BINARY_FRAME:
			if (wsi->ws->opcode == LWSWSOPC_BINARY_FRAME)
				wsi->ws->check_utf8 = 0;
			if (wsi->ws->continuation_possible) {
				lws_close_reason(wsi,
					LWS_CLOSE_STATUS_PROTOCOL_ERR,
					(uint8_t *)"bad cont", 8);
				return -1;
			}
			wsi->ws->rsv_first_msg = (c & 0x70);
#if !defined(LWS_WITHOUT_EXTENSIONS)
			/*
			 *  set the expectation that we will have to
			 * fake up the zlib trailer to the inflator for this
			 * frame
			 */
			wsi->ws->pmd_trailer_application = !!(c & 0x40);
#endif
			wsi->ws->frame_is_binary =
			     wsi->ws->opcode == LWSWSOPC_BINARY_FRAME;
			wsi->ws->first_fragment = 1;
			wsi->ws->continuation_possible = !wsi->ws->final;
			break;
		case LWSWSOPC_CONTINUATION:
			if (!wsi->ws->continuation_possible) {
				lws_close_reason(wsi,
					LWS_CLOSE_STATUS_PROTOCOL_ERR,
					(uint8_t *)"bad cont", 8);
				return -1;
			}
			break;
		case LWSWSOPC_CLOSE:
			wsi->ws->check_utf8 = 0;
			wsi->ws->utf8 = 0;
			break;
		case 3:
		case 4:
		case 5:
		case 6:
		case 7:
		case 0xb:
		case 0xc:
		case 0xd:
		case 0xe:
		case 0xf:
			lws_close_reason(wsi, LWS_CLOSE_STATUS_PROTOCOL_ERR,
					(uint8_t *)"bad opc", 7);
			lwsl_info("illegal opcode\n");
			return -1;
		}

		if (wsi->ws->owed_a_fin &&
		    (wsi->ws->opcode == LWSWSOPC_TEXT_FRAME ||
		     wsi->ws->opcode == LWSWSOPC_BINARY_FRAME)) {
			lwsl_info("hey you owed us a FIN\n");
			lws_close_reason(wsi, LWS_CLOSE_STATUS_PROTOCOL_ERR,
					(uint8_t *)"bad fin", 7);
			return -1;
		}
		if ((!(wsi->ws->opcode & 8)) && wsi->ws->final) {
			wsi->ws->continuation_possible = 0;
			wsi->ws->owed_a_fin = 0;
		}

		if (!wsi->ws->final)
			wsi->ws->owed_a_fin = 1;

		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN;
		if (wsi->ws->rsv &&
		    (
#if !defined(LWS_WITHOUT_EXTENSIONS)
				    !wsi->ws->count_act_ext ||
#endif
				    (wsi->ws->rsv & ~0x40))) {
			lws_close_reason(wsi, LWS_CLOSE_STATUS_PROTOCOL_ERR,
					 (uint8_t *)"rsv bits", 8);
			return -1;
		}
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN:

		wsi->ws->this_frame_masked = !!(c & 0x80);

		switch (c & 0x7f) {
		case 126:
			/* control frames are not allowed to have big lengths */
			if (wsi->ws->opcode & 8)
				goto illegal_ctl_length;

			wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN16_2;
			break;
		case 127:
			/* control frames are not allowed to have big lengths */
			if (wsi->ws->opcode & 8)
				goto illegal_ctl_length;

			wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_8;
			break;
		default:
			wsi->ws->rx_packet_length = c & 0x7f;


			if (wsi->ws->this_frame_masked)
				wsi->lws_rx_parse_state =
						LWS_RXPS_07_COLLECT_FRAME_KEY_1;
			else
				if (wsi->ws->rx_packet_length) {
					wsi->lws_rx_parse_state =
					LWS_RXPS_WS_FRAME_PAYLOAD;
				} else {
					wsi->lws_rx_parse_state = LWS_RXPS_NEW;
					goto spill;
				}
			break;
		}
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN16_2:
		wsi->ws->rx_packet_length = c << 8;
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN16_1;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN16_1:
		wsi->ws->rx_packet_length |= c;
		if (wsi->ws->this_frame_masked)
			wsi->lws_rx_parse_state =
					LWS_RXPS_07_COLLECT_FRAME_KEY_1;
		else {
			wsi->lws_rx_parse_state =
				LWS_RXPS_WS_FRAME_PAYLOAD;
		}
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_8:
		if (c & 0x80) {
			lwsl_warn("b63 of length must be zero\n");
			/* kill the connection */
			return -1;
		}
#if defined __LP64__
		wsi->ws->rx_packet_length = ((size_t)c) << 56;
#else
		wsi->ws->rx_packet_length = 0;
#endif
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_7;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_7:
#if defined __LP64__
		wsi->ws->rx_packet_length |= ((size_t)c) << 48;
#endif
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_6;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_6:
#if defined __LP64__
		wsi->ws->rx_packet_length |= ((size_t)c) << 40;
#endif
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_5;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_5:
#if defined __LP64__
		wsi->ws->rx_packet_length |= ((size_t)c) << 32;
#endif
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_4;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_4:
		wsi->ws->rx_packet_length |= ((size_t)c) << 24;
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_3;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_3:
		wsi->ws->rx_packet_length |= ((size_t)c) << 16;
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_2;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_2:
		wsi->ws->rx_packet_length |= ((size_t)c) << 8;
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_1;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_1:
		wsi->ws->rx_packet_length |= ((size_t)c);
		if (wsi->ws->this_frame_masked)
			wsi->lws_rx_parse_state =
					LWS_RXPS_07_COLLECT_FRAME_KEY_1;
		else
			wsi->lws_rx_parse_state = LWS_RXPS_WS_FRAME_PAYLOAD;
		break;

	case LWS_RXPS_07_COLLECT_FRAME_KEY_1:
		wsi->ws->mask[0] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;
		wsi->lws_rx_parse_state = LWS_RXPS_07_COLLECT_FRAME_KEY_2;
		break;

	case LWS_RXPS_07_COLLECT_FRAME_KEY_2:
		wsi->ws->mask[1] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;
		wsi->lws_rx_parse_state = LWS_RXPS_07_COLLECT_FRAME_KEY_3;
		break;

	case LWS_RXPS_07_COLLECT_FRAME_KEY_3:
		wsi->ws->mask[2] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;
		wsi->lws_rx_parse_state = LWS_RXPS_07_COLLECT_FRAME_KEY_4;
		break;

	case LWS_RXPS_07_COLLECT_FRAME_KEY_4:
		wsi->ws->mask[3] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;
		wsi->lws_rx_parse_state = LWS_RXPS_WS_FRAME_PAYLOAD;
		wsi->ws->mask_idx = 0;
		if (wsi->ws->rx_packet_length == 0) {
			wsi->lws_rx_parse_state = LWS_RXPS_NEW;
			goto spill;
		}
		break;


	case LWS_RXPS_WS_FRAME_PAYLOAD:
		assert(wsi->ws->rx_ubuf);

		if (wsi->ws->rx_ubuf_head + LWS_PRE >= wsi->ws->rx_ubuf_alloc) {
			lwsl_err("Attempted overflow \n");
			return -1;
		}
		if (!(already_processed & ALREADY_PROCESSED_IGNORE_CHAR)) {
			if (wsi->ws->all_zero_nonce)
				wsi->ws->rx_ubuf[LWS_PRE +
				                 (wsi->ws->rx_ubuf_head++)] = c;
			else
				wsi->ws->rx_ubuf[LWS_PRE +
				                 (wsi->ws->rx_ubuf_head++)] =
				   c ^ wsi->ws->mask[(wsi->ws->mask_idx++) & 3];

			--wsi->ws->rx_packet_length;
		}

		if (!wsi->ws->rx_packet_length) {
			lwsl_debug("%s: ws fragment length exhausted\n",
				   __func__);
			/* spill because we have the whole frame */
			wsi->lws_rx_parse_state = LWS_RXPS_NEW;
			goto spill;
		}
#if !defined(LWS_WITHOUT_EXTENSIONS)
		if (wsi->ws->rx_draining_ext) {
			lwsl_debug("%s: UNTIL_EXHAUSTED draining\n", __func__);
			goto drain_extension;
		}
#endif
		/*
		 * if there's no protocol max frame size given, we are
		 * supposed to default to context->pt_serv_buf_size
		 */
		if (!wsi->protocol->rx_buffer_size &&
		    wsi->ws->rx_ubuf_head != wsi->context->pt_serv_buf_size)
			break;

		if (wsi->protocol->rx_buffer_size &&
		    wsi->ws->rx_ubuf_head != wsi->protocol->rx_buffer_size)
			break;

		/* spill because we filled our rx buffer */
spill:
		/*
		 * is this frame a control packet we should take care of at this
		 * layer?  If so service it and hide it from the user callback
		 */

		lwsl_parser("spill on %s\n", wsi->protocol->name);

		switch (wsi->ws->opcode) {
		case LWSWSOPC_CLOSE:

			if (wsi->ws->peer_has_sent_close)
				break;

			wsi->ws->peer_has_sent_close = 1;

			pp = &wsi->ws->rx_ubuf[LWS_PRE];
			if (lws_check_opt(wsi->context->options,
					  LWS_SERVER_OPTION_VALIDATE_UTF8) &&
			    wsi->ws->rx_ubuf_head > 2 &&
			    lws_check_utf8(&wsi->ws->utf8, pp + 2,
					   wsi->ws->rx_ubuf_head - 2))
				goto utf8_fail;

			/* is this an acknowledgment of our close? */
			if (lwsi_state(wsi) == LRS_AWAITING_CLOSE_ACK) {
				/*
				 * fine he has told us he is closing too, let's
				 * finish our close
				 */
				lwsl_parser("seen client close ack\n");
				return -1;
			}
			if (lwsi_state(wsi) == LRS_RETURNED_CLOSE)
				/* if he sends us 2 CLOSE, kill him */
				return -1;

			if (lws_partial_buffered(wsi)) {
				/*
				 * if we're in the middle of something,
				 * we can't do a normal close response and
				 * have to just close our end.
				 */
				wsi->socket_is_permanently_unusable = 1;
				lwsl_parser("Closing on peer close "
					    "due to pending tx\n");
				return -1;
			}

			if (wsi->ws->rx_ubuf_head >= 2) {
				close_code = (pp[0] << 8) | pp[1];
				if (close_code < 1000 ||
				    close_code == 1004 ||
				    close_code == 1005 ||
				    close_code == 1006 ||
				    close_code == 1012 ||
				    close_code == 1013 ||
				    close_code == 1014 ||
				    close_code == 1015 ||
				    (close_code >= 1016 && close_code < 3000)
				) {
					pp[0] = (LWS_CLOSE_STATUS_PROTOCOL_ERR >> 8) & 0xff;
					pp[1] = LWS_CLOSE_STATUS_PROTOCOL_ERR & 0xff;
				}
			}

			if (user_callback_handle_rxflow(
					wsi->protocol->callback, wsi,
					LWS_CALLBACK_WS_PEER_INITIATED_CLOSE,
					wsi->user_space,
					&wsi->ws->rx_ubuf[LWS_PRE],
					wsi->ws->rx_ubuf_head))
				return -1;

			lwsl_parser("server sees client close packet\n");
			lwsi_set_state(wsi, LRS_RETURNED_CLOSE);
			/* deal with the close packet contents as a PONG */
			wsi->ws->payload_is_close = 1;
			goto process_as_ping;

		case LWSWSOPC_PING:
			lwsl_info("received %d byte ping, sending pong\n",
						 (int)wsi->ws->rx_ubuf_head);

			if (wsi->ws->ping_pending_flag) {
				/*
				 * there is already a pending ping payload
				 * we should just log and drop
				 */
				lwsl_parser("DROP PING since one pending\n");
				goto ping_drop;
			}
process_as_ping:
			/* control packets can only be < 128 bytes long */
			if (wsi->ws->rx_ubuf_head > 128 - 3) {
				lwsl_parser("DROP PING payload too large\n");
				goto ping_drop;
			}

			/* stash the pong payload */
			memcpy(wsi->ws->ping_payload_buf + LWS_PRE,
			       &wsi->ws->rx_ubuf[LWS_PRE],
				wsi->ws->rx_ubuf_head);

			wsi->ws->ping_payload_len = wsi->ws->rx_ubuf_head;
			wsi->ws->ping_pending_flag = 1;

			/* get it sent as soon as possible */
			lws_callback_on_writable(wsi);
ping_drop:
			wsi->ws->rx_ubuf_head = 0;
			return 0;

		case LWSWSOPC_PONG:
			lwsl_info("received pong\n");
			lwsl_hexdump(&wsi->ws->rx_ubuf[LWS_PRE],
			             wsi->ws->rx_ubuf_head);

			lws_validity_confirmed(wsi);

			/* issue it */
			callback_action = LWS_CALLBACK_RECEIVE_PONG;
			break;

		case LWSWSOPC_TEXT_FRAME:
		case LWSWSOPC_BINARY_FRAME:
		case LWSWSOPC_CONTINUATION:
			break;

		default:
			lwsl_parser("unknown opc %x\n", wsi->ws->opcode);

			return -1;
		}

		/*
		 * No it's real payload, pass it up to the user callback.
		 *
		 * We have been statefully collecting it in the
		 * LWS_RXPS_WS_FRAME_PAYLOAD clause above.
		 *
		 * It's nicely buffered with the pre-padding taken care of
		 * so it can be sent straight out again using lws_write.
		 *
		 * However, now we have a chunk of it, we want to deal with it
		 * all here.  Since this may be input to permessage-deflate and
		 * there are block limits on that for input and output, we may
		 * need to iterate.
		 */

		pmdrx.eb_in.token = &wsi->ws->rx_ubuf[LWS_PRE];
		pmdrx.eb_in.len = wsi->ws->rx_ubuf_head;

		/* for the non-pm-deflate case */

		pmdrx.eb_out = pmdrx.eb_in;

		if (wsi->ws->opcode == LWSWSOPC_PONG && !pmdrx.eb_in.len)
			goto already_done;
#if !defined(LWS_WITHOUT_EXTENSIONS)
drain_extension:
#endif

		do {

//			lwsl_notice("%s: pmdrx.eb_in.len: %d\n", __func__,
//					(int)pmdrx.eb_in.len);

			if (lwsi_state(wsi) == LRS_RETURNED_CLOSE ||
			    lwsi_state(wsi) == LRS_AWAITING_CLOSE_ACK)
				goto already_done;

			n = PMDR_DID_NOTHING;

#if !defined(LWS_WITHOUT_EXTENSIONS)
			lin = pmdrx.eb_in.len;
			//if (lin)
			//	lwsl_hexdump_notice(ebuf.token, ebuf.len);
			lwsl_ext("%s: +++ passing %d %p to ext\n", __func__,
					pmdrx.eb_in.len, pmdrx.eb_in.token);

			n = lws_ext_cb_active(wsi, LWS_EXT_CB_PAYLOAD_RX, &pmdrx, 0);
			lwsl_debug("%s: ext says %d / ebuf.len %d\n", __func__,
				   n, pmdrx.eb_out.len);
			if (wsi->ws->rx_draining_ext)
				already_processed &= ~ALREADY_PROCESSED_NO_CB;
#endif

			/*
			 * ebuf may be pointing somewhere completely different
			 * now, it's the output
			 */
#if !defined(LWS_WITHOUT_EXTENSIONS)
			if (n < 0) {
				/*
				 * we may rely on this to get RX, just drop
				 * connection
				 */
				wsi->socket_is_permanently_unusable = 1;
				return -1;
			}
			if (n == PMDR_DID_NOTHING)
				break;
#endif
			lwsl_debug("%s: post ext ret %d, ebuf in %d / out %d\n",
				    __func__, n, pmdrx.eb_in.len,
				    pmdrx.eb_out.len);

#if !defined(LWS_WITHOUT_EXTENSIONS)
			if (rx_draining_ext && !pmdrx.eb_out.len) {
				lwsl_debug("   --- ending drain on 0 read\n");
				goto already_done;
			}

			if (n == PMDR_HAS_PENDING)
				/*
				 * extension had more...
				 * main loop will come back
				 */
				lws_add_wsi_to_draining_ext_list(wsi);
			else
				lws_remove_wsi_from_draining_ext_list(wsi);

			rx_draining_ext = wsi->ws->rx_draining_ext;
#endif

			if (pmdrx.eb_out.len &&
			    wsi->ws->check_utf8 && !wsi->ws->defeat_check_utf8) {
				if (lws_check_utf8(&wsi->ws->utf8,
						   pmdrx.eb_out.token,
						   pmdrx.eb_out.len)) {
					lws_close_reason(wsi,
						LWS_CLOSE_STATUS_INVALID_PAYLOAD,
						(uint8_t *)"bad utf8", 8);
					goto utf8_fail;
				}

				/* we are ending partway through utf-8 character? */
				if (!wsi->ws->rx_packet_length &&
				    wsi->ws->final && wsi->ws->utf8
#if !defined(LWS_WITHOUT_EXTENSIONS)
				    /* if ext not negotiated, going to be UNKNOWN */
				    && (n == PMDR_EMPTY_FINAL || n == PMDR_UNKNOWN)
#endif
				) {
					lwsl_info("FINAL utf8 error\n");
					lws_close_reason(wsi,
						LWS_CLOSE_STATUS_INVALID_PAYLOAD,
						(uint8_t *)"partial utf8", 12);
utf8_fail:
					lwsl_notice("utf8 error\n");
					lwsl_hexdump_notice(pmdrx.eb_out.token,
							    pmdrx.eb_out.len);

					return -1;
				}
			}

			/* if pmd not enabled, in == out */

			if (n == PMDR_DID_NOTHING
#if !defined(LWS_WITHOUT_EXTENSIONS)
				       	||
			    n == PMDR_UNKNOWN
#endif
			    )
				pmdrx.eb_in.len -= pmdrx.eb_out.len;

	if (!wsi->wsistate_pre_close &&
			    (pmdrx.eb_out.len >= 0 ||
			     callback_action == LWS_CALLBACK_RECEIVE_PONG ||
						       n == PMDR_EMPTY_FINAL)) {
				if (pmdrx.eb_out.len)
					pmdrx.eb_out.token[pmdrx.eb_out.len] = '\0';

				if (wsi->protocol->callback &&
				    !(already_processed & ALREADY_PROCESSED_NO_CB)) {
					if (callback_action ==
						      LWS_CALLBACK_RECEIVE_PONG)
						lwsl_info("Doing pong callback\n");

					ret = user_callback_handle_rxflow(
						wsi->protocol->callback, wsi,
						(enum lws_callback_reasons)
							     callback_action,
						wsi->user_space,
						pmdrx.eb_out.token,
						pmdrx.eb_out.len);
				}
				wsi->ws->first_fragment = 0;
			}

#if !defined(LWS_WITHOUT_EXTENSIONS)
			if (!lin)
				break;
#endif

		} while (pmdrx.eb_in.len
#if !defined(LWS_WITHOUT_EXTENSIONS)
				|| rx_draining_ext
#endif
		);

already_done:
		wsi->ws->rx_ubuf_head = 0;
		break;
	}

	return ret;

illegal_ctl_length:

	lwsl_warn("Control frame with xtended length is illegal\n");
	/* kill the connection */
	return -1;
}